

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::integer_to_string<unsigned_long_long>
                   (char_t *begin,char_t *end,unsigned_long_long value,bool negative)

{
  undefined1 auVar1 [16];
  char_t *pcVar2;
  unsigned_long_long local_38;
  unsigned_long_long rest;
  char_t *result;
  bool negative_local;
  unsigned_long_long value_local;
  char_t *end_local;
  char_t *begin_local;
  
  local_38 = value;
  if (negative) {
    local_38 = -value;
  }
  rest = local_38;
  result = end + -1;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rest;
    pcVar2 = result + -1;
    *result = SUB161(auVar1 % ZEXT816(10),0) + '0';
    rest = rest / 10;
    result = pcVar2;
  } while (rest != 0);
  *pcVar2 = '-';
  return pcVar2 + (int)(uint)((negative ^ 0xffU) & 1);
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW char_t* integer_to_string(char_t* begin, char_t* end, U value, bool negative)
	{
		char_t* result = end - 1;
		U rest = negative ? 0 - value : value;

		do
		{
			*result-- = static_cast<char_t>('0' + (rest % 10));
			rest /= 10;
		}
		while (rest);

		assert(result >= begin);
		(void)begin;

		*result = '-';

		return result + !negative;
	}